

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O0

void do_test(uv_udp_recv_cb recv_cb,int bind_flags)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  undefined1 auVar4 [16];
  undefined1 local_158 [4];
  int r;
  char dst [256];
  uv_buf_t buf;
  int addr_len;
  int addr6_len;
  sockaddr_in addr;
  sockaddr_in6 addr6;
  int bind_flags_local;
  uv_udp_recv_cb recv_cb_local;
  
  addr6.sin6_addr.__in6_u.__u6_addr32[3] = bind_flags;
  unique0x1000090f = recv_cb;
  iVar1 = uv_ip6_addr("::0",0x23a3,addr.sin_zero);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0x9a,"0 == uv_ip6_addr(\"::0\", TEST_PORT, &addr6)");
    abort();
  }
  uVar3 = uv_default_loop();
  iVar1 = uv_udp_init(uVar3,&server);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0x9d,"r == 0");
    abort();
  }
  iVar1 = uv_udp_bind(&server,addr.sin_zero,addr6.sin6_addr.__in6_u.__u6_addr32[3]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xa0,"r == 0");
    abort();
  }
  buf.len._4_4_ = 0x1c;
  iVar1 = uv_udp_getsockname(&server,addr.sin_zero,(undefined1 *)((long)&buf.len + 4));
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xa3,"uv_udp_getsockname(&server, (struct sockaddr*) &addr6, &addr6_len) == 0");
    abort();
  }
  iVar1 = uv_inet_ntop(addr.sin_zero._0_2_,&addr6,local_158,0x100);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xa4,"uv_inet_ntop(addr6.sin6_family, &addr6.sin6_addr, dst, sizeof(dst)) == 0");
    abort();
  }
  printf("on [%.*s]:%d\n",0x100,local_158,(ulong)(ushort)addr.sin_zero._2_2_);
  iVar1 = uv_udp_recv_start(&server,alloc_cb,stack0xfffffffffffffff0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xa8,"r == 0");
    abort();
  }
  uVar3 = uv_default_loop();
  iVar1 = uv_udp_init(uVar3,&client);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xab,"r == 0");
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr_len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xad,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_inet_ntop((undefined2)addr_len,&addr6_len,local_158,0x100);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xae,"uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0");
    abort();
  }
  printf("to [%.*s]:%d\n",0x100,local_158,(ulong)addr_len._2_2_);
  uVar2 = uv_os_getpid();
  iVar1 = snprintf(data,10,"PING%5u",(ulong)(uVar2 & 0xffff));
  if (iVar1 != 9) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xb2,"9 == snprintf(data, sizeof(data), \"PING%5u\", uv_os_getpid() & 0xFFFF)");
    abort();
  }
  auVar4 = uv_buf_init(data,9);
  buf.base = auVar4._8_8_;
  dst._248_8_ = auVar4._0_8_;
  printf("sending %s\n",data);
  iVar1 = uv_udp_send(&req_,&client,dst + 0xf8,1,&addr_len,send_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xbc,"r == 0");
    abort();
  }
  buf.len._0_4_ = 0x10;
  iVar1 = uv_udp_getsockname(&client,&addr_len,&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xbf,"uv_udp_getsockname(&client, (struct sockaddr*) &addr, &addr_len) == 0");
    abort();
  }
  iVar1 = uv_inet_ntop((undefined2)addr_len,&addr6_len,local_158,0x100);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xc0,"uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0");
    abort();
  }
  printf("from [%.*s]:%d\n",0x100,local_158,(ulong)addr_len._2_2_);
  client_port = addr_len._2_2_;
  uVar3 = uv_default_loop();
  iVar1 = uv_timer_init(uVar3,&timeout);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xc5,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start(&timeout,timeout_cb,500,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,200,"r == 0");
    abort();
  }
  if (close_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xca,"close_cb_called == 0");
    abort();
  }
  if (send_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xcb,"send_cb_called == 0");
    abort();
  }
  if (recv_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xcc,"recv_cb_called == 0");
    abort();
  }
  uVar3 = uv_default_loop();
  uv_run(uVar3,0);
  if (close_cb_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xd0,"close_cb_called == 3");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
            ,0xd2,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return;
}

Assistant:

static void do_test(uv_udp_recv_cb recv_cb, int bind_flags) {
  struct sockaddr_in6 addr6;
  struct sockaddr_in addr;
  int addr6_len;
  int addr_len;
  uv_buf_t buf;
  char dst[256];
  int r;

  ASSERT(0 == uv_ip6_addr("::0", TEST_PORT, &addr6));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr6, bind_flags);
  ASSERT(r == 0);

  addr6_len = sizeof(addr6);
  ASSERT(uv_udp_getsockname(&server, (struct sockaddr*) &addr6, &addr6_len) == 0);
  ASSERT(uv_inet_ntop(addr6.sin6_family, &addr6.sin6_addr, dst, sizeof(dst)) == 0);
  printf("on [%.*s]:%d\n", (int) sizeof(dst), dst, addr6.sin6_port);

  r = uv_udp_recv_start(&server, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0);
  printf("to [%.*s]:%d\n", (int) sizeof(dst), dst, addr.sin_port);

  /* Create some unique data to send */
  ASSERT(9 == snprintf(data, sizeof(data), "PING%5u", uv_os_getpid() & 0xFFFF));
  buf = uv_buf_init(data, 9);
  printf("sending %s\n", data);

  r = uv_udp_send(&req_,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  addr_len = sizeof(addr);
  ASSERT(uv_udp_getsockname(&client, (struct sockaddr*) &addr, &addr_len) == 0);
  ASSERT(uv_inet_ntop(addr.sin_family, &addr.sin_addr, dst, sizeof(dst)) == 0);
  printf("from [%.*s]:%d\n", (int) sizeof(dst), dst, addr.sin_port);
  client_port = addr.sin_port;

  r = uv_timer_init(uv_default_loop(), &timeout);
  ASSERT(r == 0);

  r = uv_timer_start(&timeout, timeout_cb, 500, 0);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(send_cb_called == 0);
  ASSERT(recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
}